

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_32x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar20;
  ushort uVar27;
  ushort uVar31;
  ushort uVar35;
  ushort uVar39;
  ushort uVar43;
  ushort uVar47;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar26 [16];
  int y_mask_2;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_bottom_left4;
  __m128i scaled_bottom_left3;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i top4;
  __m128i top3;
  __m128i top2;
  __m128i top1;
  __m128i top_hi;
  __m128i top_lo;
  __m128i scale;
  __m128i zero;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i bottom_left;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_192c;
  int local_18ec;
  int local_18ac;
  int local_186c;
  undefined8 *local_16d0;
  byte bStack_1550;
  byte bStack_154f;
  byte bStack_154e;
  byte bStack_154d;
  byte bStack_154c;
  byte bStack_154b;
  byte bStack_154a;
  byte bStack_1549;
  byte bStack_1530;
  byte bStack_152f;
  byte bStack_152e;
  byte bStack_152d;
  byte bStack_152c;
  byte bStack_152b;
  byte bStack_152a;
  byte bStack_1529;
  byte local_1478;
  byte bStack_1477;
  byte bStack_1476;
  byte bStack_1475;
  byte bStack_1474;
  byte bStack_1473;
  byte bStack_1472;
  byte bStack_1471;
  byte local_1438;
  byte bStack_1437;
  byte bStack_1436;
  byte bStack_1435;
  byte bStack_1434;
  byte bStack_1433;
  byte bStack_1432;
  byte bStack_1431;
  ushort uStack_13a2;
  ushort uStack_139a;
  ushort uStack_1382;
  ushort uStack_137a;
  ushort uStack_1362;
  ushort uStack_135a;
  ushort uStack_1346;
  ushort uStack_1344;
  ushort uStack_1342;
  ushort uStack_133e;
  ushort uStack_133c;
  ushort uStack_133a;
  ushort uStack_1166;
  ushort uStack_1164;
  ushort uStack_1162;
  ushort uStack_115e;
  ushort uStack_115c;
  ushort uStack_115a;
  ushort uStack_1146;
  ushort uStack_1144;
  ushort uStack_1142;
  ushort uStack_113e;
  ushort uStack_113c;
  ushort uStack_113a;
  short local_fc8;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fc0;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  ushort uStack_fa6;
  ushort uStack_fa4;
  ushort uStack_fa2;
  ushort uStack_f9e;
  ushort uStack_f9c;
  ushort uStack_f9a;
  short local_f98;
  short sStack_f96;
  short sStack_f94;
  short sStack_f92;
  short sStack_f90;
  short sStack_f8e;
  short sStack_f8c;
  short sStack_f8a;
  ushort uStack_f86;
  ushort uStack_f84;
  ushort uStack_f82;
  ushort uStack_f7e;
  ushort uStack_f7c;
  ushort uStack_f7a;
  ushort uStack_de6;
  ushort uStack_de4;
  ushort uStack_de2;
  ushort uStack_dde;
  ushort uStack_ddc;
  ushort uStack_dda;
  ushort uStack_dc6;
  ushort uStack_dc4;
  ushort uStack_dc2;
  ushort uStack_dbe;
  ushort uStack_dbc;
  ushort uStack_dba;
  short local_c48;
  short sStack_c46;
  short sStack_c44;
  short sStack_c42;
  short sStack_c40;
  short sStack_c3e;
  short sStack_c3c;
  short sStack_c3a;
  ushort uStack_c26;
  ushort uStack_c24;
  ushort uStack_c22;
  ushort uStack_c1e;
  ushort uStack_c1c;
  ushort uStack_c1a;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  ushort uStack_c06;
  ushort uStack_c04;
  ushort uStack_c02;
  ushort uStack_bfe;
  ushort uStack_bfc;
  ushort uStack_bfa;
  ushort uStack_a66;
  ushort uStack_a64;
  ushort uStack_a62;
  ushort uStack_a5e;
  ushort uStack_a5c;
  ushort uStack_a5a;
  ushort uStack_a46;
  ushort uStack_a44;
  ushort uStack_a42;
  ushort uStack_a3e;
  ushort uStack_a3c;
  ushort uStack_a3a;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  ushort uStack_8a6;
  ushort uStack_8a4;
  ushort uStack_8a2;
  ushort uStack_89e;
  ushort uStack_89c;
  ushort uStack_89a;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  ushort uStack_886;
  ushort uStack_884;
  ushort uStack_882;
  ushort uStack_87e;
  ushort uStack_87c;
  ushort uStack_87a;
  ushort uStack_6e6;
  ushort uStack_6e4;
  ushort uStack_6e2;
  ushort uStack_6de;
  ushort uStack_6dc;
  ushort uStack_6da;
  ushort uStack_6c6;
  ushort uStack_6c4;
  ushort uStack_6c2;
  ushort uStack_6be;
  ushort uStack_6bc;
  ushort uStack_6ba;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  ushort uStack_526;
  ushort uStack_524;
  ushort uStack_522;
  ushort uStack_51e;
  ushort uStack_51c;
  ushort uStack_51a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  ushort uStack_506;
  ushort uStack_504;
  ushort uStack_502;
  ushort uStack_4fe;
  ushort uStack_4fc;
  ushort uStack_4fa;
  __m128i scaled_bottom_left_y_3;
  __m128i weights_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i scaled_bottom_left_y_2;
  __m128i weights_y_2;
  __m128i y_select_2;
  
  bVar1 = *(byte *)(in_RCX + 0x1f);
  uVar19 = CONCAT11(0,bVar1);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  local_1438 = (byte)uVar2;
  bStack_1437 = (byte)((ulong)uVar2 >> 8);
  bStack_1436 = (byte)((ulong)uVar2 >> 0x10);
  bStack_1435 = (byte)((ulong)uVar2 >> 0x18);
  bStack_1434 = (byte)((ulong)uVar2 >> 0x20);
  bStack_1433 = (byte)((ulong)uVar2 >> 0x28);
  bStack_1432 = (byte)((ulong)uVar2 >> 0x30);
  bStack_1431 = (byte)((ulong)uVar2 >> 0x38);
  bStack_1530 = (byte)uVar3;
  bStack_152f = (byte)((ulong)uVar3 >> 8);
  bStack_152e = (byte)((ulong)uVar3 >> 0x10);
  bStack_152d = (byte)((ulong)uVar3 >> 0x18);
  bStack_152c = (byte)((ulong)uVar3 >> 0x20);
  bStack_152b = (byte)((ulong)uVar3 >> 0x28);
  bStack_152a = (byte)((ulong)uVar3 >> 0x30);
  bStack_1529 = (byte)((ulong)uVar3 >> 0x38);
  local_1478 = (byte)uVar4;
  bStack_1477 = (byte)((ulong)uVar4 >> 8);
  bStack_1476 = (byte)((ulong)uVar4 >> 0x10);
  bStack_1475 = (byte)((ulong)uVar4 >> 0x18);
  bStack_1474 = (byte)((ulong)uVar4 >> 0x20);
  bStack_1473 = (byte)((ulong)uVar4 >> 0x28);
  bStack_1472 = (byte)((ulong)uVar4 >> 0x30);
  bStack_1471 = (byte)((ulong)uVar4 >> 0x38);
  bStack_1550 = (byte)uVar5;
  bStack_154f = (byte)((ulong)uVar5 >> 8);
  bStack_154e = (byte)((ulong)uVar5 >> 0x10);
  bStack_154d = (byte)((ulong)uVar5 >> 0x18);
  bStack_154c = (byte)((ulong)uVar5 >> 0x20);
  bStack_154b = (byte)((ulong)uVar5 >> 0x28);
  bStack_154a = (byte)((ulong)uVar5 >> 0x30);
  bStack_1549 = (byte)((ulong)uVar5 >> 0x38);
  uStack_1346 = (ushort)bVar1;
  uStack_1344 = (ushort)bVar1;
  uStack_1342 = (ushort)bVar1;
  uStack_133e = (ushort)bVar1;
  uStack_133c = (ushort)bVar1;
  uStack_133a = (ushort)bVar1;
  uStack_1362 = (ushort)bVar1;
  uStack_135a = (ushort)bVar1;
  uStack_1382 = (ushort)bVar1;
  uStack_137a = (ushort)bVar1;
  uStack_13a2 = (ushort)bVar1;
  uStack_139a = (ushort)bVar1;
  local_16d0 = in_RDI;
  for (local_186c = 0x1000100; local_186c < 0xf0e0f0f; local_186c = local_186c + 0x2020202) {
    auVar18._8_7_ = 0x9d00a900b600c4;
    auVar18._0_8_ = 0xd200e100f000ff;
    auVar18[0xf] = 0;
    auVar17._8_8_ = CONCAT44(local_186c,local_186c);
    auVar17._0_8_ = CONCAT44(local_186c,local_186c);
    auVar24 = pshufb(auVar18,auVar17);
    auVar16._2_2_ = uStack_1346 * 0x10;
    auVar16._0_2_ = uVar19;
    auVar16._4_2_ = uStack_1344 * 0x1f;
    auVar16._6_2_ = uStack_1342 * 0x2e;
    auVar16._10_2_ = uStack_133e * 0x4a;
    auVar16._8_2_ = uVar19 * 0x3c;
    auVar16._12_2_ = uStack_133c * 0x57;
    auVar16._14_2_ = uStack_133a * 99;
    auVar15._8_8_ = CONCAT44(local_186c,local_186c);
    auVar15._0_8_ = CONCAT44(local_186c,local_186c);
    auVar25 = pshufb(auVar16,auVar15);
    uStack_506 = (ushort)bStack_1437;
    uStack_504 = (ushort)bStack_1436;
    uStack_502 = (ushort)bStack_1435;
    uStack_4fe = (ushort)bStack_1433;
    uStack_4fc = (ushort)bStack_1432;
    uStack_4fa = (ushort)bStack_1431;
    local_518 = auVar24._0_2_;
    sStack_516 = auVar24._2_2_;
    sStack_514 = auVar24._4_2_;
    sStack_512 = auVar24._6_2_;
    sStack_510 = auVar24._8_2_;
    sStack_50e = auVar24._10_2_;
    sStack_50c = auVar24._12_2_;
    sStack_50a = auVar24._14_2_;
    uStack_526 = (ushort)bStack_152f;
    uStack_524 = (ushort)bStack_152e;
    uStack_522 = (ushort)bStack_152d;
    uStack_51e = (ushort)bStack_152b;
    uStack_51c = (ushort)bStack_152a;
    uStack_51a = (ushort)bStack_1529;
    local_548 = auVar25._0_2_;
    sStack_546 = auVar25._2_2_;
    sStack_544 = auVar25._4_2_;
    sStack_542 = auVar25._6_2_;
    sStack_540 = auVar25._8_2_;
    sStack_53e = auVar25._10_2_;
    sStack_53c = auVar25._12_2_;
    sStack_53a = auVar25._14_2_;
    uVar20 = local_548 + (ushort)local_1438 * local_518 + 0x80;
    uVar27 = sStack_546 + uStack_506 * sStack_516 + 0x80;
    uVar31 = sStack_544 + uStack_504 * sStack_514 + 0x80;
    uVar35 = sStack_542 + uStack_502 * sStack_512 + 0x80;
    uVar39 = sStack_540 + (ushort)bStack_1434 * sStack_510 + 0x80;
    uVar43 = sStack_53e + uStack_4fe * sStack_50e + 0x80;
    uVar47 = sStack_53c + uStack_4fc * sStack_50c + 0x80;
    uVar51 = sStack_53a + uStack_4fa * sStack_50a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_548 + (ushort)bStack_1530 * local_518 + 0x80;
    uVar29 = sStack_546 + uStack_526 * sStack_516 + 0x80;
    uVar33 = sStack_544 + uStack_524 * sStack_514 + 0x80;
    uVar37 = sStack_542 + uStack_522 * sStack_512 + 0x80;
    uVar41 = sStack_540 + (ushort)bStack_152c * sStack_510 + 0x80;
    uVar45 = sStack_53e + uStack_51e * sStack_50e + 0x80;
    uVar49 = sStack_53c + uStack_51c * sStack_50c + 0x80;
    uVar53 = sStack_53a + uStack_51a * sStack_50a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_16d0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_16d0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_6c6 = (ushort)bStack_1477;
    uStack_6c4 = (ushort)bStack_1476;
    uStack_6c2 = (ushort)bStack_1475;
    uStack_6be = (ushort)bStack_1473;
    uStack_6bc = (ushort)bStack_1472;
    uStack_6ba = (ushort)bStack_1471;
    uStack_6e6 = (ushort)bStack_154f;
    uStack_6e4 = (ushort)bStack_154e;
    uStack_6e2 = (ushort)bStack_154d;
    uStack_6de = (ushort)bStack_154b;
    uStack_6dc = (ushort)bStack_154a;
    uStack_6da = (ushort)bStack_1549;
    uVar20 = local_548 + (ushort)local_1478 * local_518 + 0x80;
    uVar27 = sStack_546 + uStack_6c6 * sStack_516 + 0x80;
    uVar31 = sStack_544 + uStack_6c4 * sStack_514 + 0x80;
    uVar35 = sStack_542 + uStack_6c2 * sStack_512 + 0x80;
    uVar39 = sStack_540 + (ushort)bStack_1474 * sStack_510 + 0x80;
    uVar43 = sStack_53e + uStack_6be * sStack_50e + 0x80;
    uVar47 = sStack_53c + uStack_6bc * sStack_50c + 0x80;
    uVar51 = sStack_53a + uStack_6ba * sStack_50a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_548 + (ushort)bStack_1550 * local_518 + 0x80;
    uVar29 = sStack_546 + uStack_6e6 * sStack_516 + 0x80;
    uVar33 = sStack_544 + uStack_6e4 * sStack_514 + 0x80;
    uVar37 = sStack_542 + uStack_6e2 * sStack_512 + 0x80;
    uVar41 = sStack_540 + (ushort)bStack_154c * sStack_510 + 0x80;
    uVar45 = sStack_53e + uStack_6de * sStack_50e + 0x80;
    uVar49 = sStack_53c + uStack_6dc * sStack_50c + 0x80;
    uVar53 = sStack_53a + uStack_6da * sStack_50a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_16d0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_16d0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_16d0 = (undefined8 *)(in_RSI + (long)local_16d0);
  }
  for (local_18ac = 0x1000100; local_18ac < 0xf0e0f0f; local_18ac = local_18ac + 0x2020202) {
    auVar14._8_7_ = 0x4a0053005c0065;
    auVar14._0_8_ = 0x6f007a00850091;
    auVar14[0xf] = 0;
    auVar13._8_8_ = CONCAT44(local_18ac,local_18ac);
    auVar13._0_8_ = CONCAT44(local_18ac,local_18ac);
    auVar24 = pshufb(auVar14,auVar13);
    auVar12._2_2_ = uStack_1346 * 0x7b;
    auVar12._0_2_ = uVar19 * 0x6f;
    auVar12._4_2_ = uStack_1344 * 0x86;
    auVar12._6_2_ = uStack_1362 * 0x91;
    auVar12._10_2_ = uStack_133e * 0xa4;
    auVar12._8_2_ = uVar19 * 0x9b;
    auVar12._12_2_ = uStack_133c * 0xad;
    auVar12._14_2_ = uStack_135a * 0xb6;
    auVar11._8_8_ = CONCAT44(local_18ac,local_18ac);
    auVar11._0_8_ = CONCAT44(local_18ac,local_18ac);
    auVar25 = pshufb(auVar12,auVar11);
    uStack_886 = (ushort)bStack_1437;
    uStack_884 = (ushort)bStack_1436;
    uStack_882 = (ushort)bStack_1435;
    uStack_87e = (ushort)bStack_1433;
    uStack_87c = (ushort)bStack_1432;
    uStack_87a = (ushort)bStack_1431;
    local_898 = auVar24._0_2_;
    sStack_896 = auVar24._2_2_;
    sStack_894 = auVar24._4_2_;
    sStack_892 = auVar24._6_2_;
    sStack_890 = auVar24._8_2_;
    sStack_88e = auVar24._10_2_;
    sStack_88c = auVar24._12_2_;
    sStack_88a = auVar24._14_2_;
    uStack_8a6 = (ushort)bStack_152f;
    uStack_8a4 = (ushort)bStack_152e;
    uStack_8a2 = (ushort)bStack_152d;
    uStack_89e = (ushort)bStack_152b;
    uStack_89c = (ushort)bStack_152a;
    uStack_89a = (ushort)bStack_1529;
    local_8c8 = auVar25._0_2_;
    sStack_8c6 = auVar25._2_2_;
    sStack_8c4 = auVar25._4_2_;
    sStack_8c2 = auVar25._6_2_;
    sStack_8c0 = auVar25._8_2_;
    sStack_8be = auVar25._10_2_;
    sStack_8bc = auVar25._12_2_;
    sStack_8ba = auVar25._14_2_;
    uVar20 = local_8c8 + (ushort)local_1438 * local_898 + 0x80;
    uVar27 = sStack_8c6 + uStack_886 * sStack_896 + 0x80;
    uVar31 = sStack_8c4 + uStack_884 * sStack_894 + 0x80;
    uVar35 = sStack_8c2 + uStack_882 * sStack_892 + 0x80;
    uVar39 = sStack_8c0 + (ushort)bStack_1434 * sStack_890 + 0x80;
    uVar43 = sStack_8be + uStack_87e * sStack_88e + 0x80;
    uVar47 = sStack_8bc + uStack_87c * sStack_88c + 0x80;
    uVar51 = sStack_8ba + uStack_87a * sStack_88a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_8c8 + (ushort)bStack_1530 * local_898 + 0x80;
    uVar29 = sStack_8c6 + uStack_8a6 * sStack_896 + 0x80;
    uVar33 = sStack_8c4 + uStack_8a4 * sStack_894 + 0x80;
    uVar37 = sStack_8c2 + uStack_8a2 * sStack_892 + 0x80;
    uVar41 = sStack_8c0 + (ushort)bStack_152c * sStack_890 + 0x80;
    uVar45 = sStack_8be + uStack_89e * sStack_88e + 0x80;
    uVar49 = sStack_8bc + uStack_89c * sStack_88c + 0x80;
    uVar53 = sStack_8ba + uStack_89a * sStack_88a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_16d0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_16d0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_a46 = (ushort)bStack_1477;
    uStack_a44 = (ushort)bStack_1476;
    uStack_a42 = (ushort)bStack_1475;
    uStack_a3e = (ushort)bStack_1473;
    uStack_a3c = (ushort)bStack_1472;
    uStack_a3a = (ushort)bStack_1471;
    uStack_a66 = (ushort)bStack_154f;
    uStack_a64 = (ushort)bStack_154e;
    uStack_a62 = (ushort)bStack_154d;
    uStack_a5e = (ushort)bStack_154b;
    uStack_a5c = (ushort)bStack_154a;
    uStack_a5a = (ushort)bStack_1549;
    uVar20 = local_8c8 + (ushort)local_1478 * local_898 + 0x80;
    uVar27 = sStack_8c6 + uStack_a46 * sStack_896 + 0x80;
    uVar31 = sStack_8c4 + uStack_a44 * sStack_894 + 0x80;
    uVar35 = sStack_8c2 + uStack_a42 * sStack_892 + 0x80;
    uVar39 = sStack_8c0 + (ushort)bStack_1474 * sStack_890 + 0x80;
    uVar43 = sStack_8be + uStack_a3e * sStack_88e + 0x80;
    uVar47 = sStack_8bc + uStack_a3c * sStack_88c + 0x80;
    uVar51 = sStack_8ba + uStack_a3a * sStack_88a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_8c8 + (ushort)bStack_1550 * local_898 + 0x80;
    uVar29 = sStack_8c6 + uStack_a66 * sStack_896 + 0x80;
    uVar33 = sStack_8c4 + uStack_a64 * sStack_894 + 0x80;
    uVar37 = sStack_8c2 + uStack_a62 * sStack_892 + 0x80;
    uVar41 = sStack_8c0 + (ushort)bStack_154c * sStack_890 + 0x80;
    uVar45 = sStack_8be + uStack_a5e * sStack_88e + 0x80;
    uVar49 = sStack_8bc + uStack_a5c * sStack_88c + 0x80;
    uVar53 = sStack_8ba + uStack_a5a * sStack_88a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_16d0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_16d0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_16d0 = (undefined8 *)(in_RSI + (long)local_16d0);
  }
  for (local_18ec = 0x1000100; local_18ec < 0xf0e0f0f; local_18ec = local_18ec + 0x2020202) {
    auVar10._8_7_ = 0x19001d00220027;
    auVar10._0_8_ = 0x2d0034003b0042;
    auVar10[0xf] = 0;
    auVar9._8_8_ = CONCAT44(local_18ec,local_18ec);
    auVar9._0_8_ = CONCAT44(local_18ec,local_18ec);
    auVar24 = pshufb(auVar10,auVar9);
    auVar8._2_2_ = uStack_1346 * 0xc5;
    auVar8._0_2_ = uVar19 * 0xbe;
    auVar8._4_2_ = uStack_1344 * 0xcc;
    auVar8._6_2_ = uStack_1382 * 0xd3;
    auVar8._10_2_ = uStack_133e * 0xde;
    auVar8._8_2_ = uVar19 * 0xd9;
    auVar8._12_2_ = uStack_133c * 0xe3;
    auVar8._14_2_ = uStack_137a * 0xe7;
    auVar7._8_8_ = CONCAT44(local_18ec,local_18ec);
    auVar7._0_8_ = CONCAT44(local_18ec,local_18ec);
    auVar25 = pshufb(auVar8,auVar7);
    uStack_c06 = (ushort)bStack_1437;
    uStack_c04 = (ushort)bStack_1436;
    uStack_c02 = (ushort)bStack_1435;
    uStack_bfe = (ushort)bStack_1433;
    uStack_bfc = (ushort)bStack_1432;
    uStack_bfa = (ushort)bStack_1431;
    local_c18 = auVar24._0_2_;
    sStack_c16 = auVar24._2_2_;
    sStack_c14 = auVar24._4_2_;
    sStack_c12 = auVar24._6_2_;
    sStack_c10 = auVar24._8_2_;
    sStack_c0e = auVar24._10_2_;
    sStack_c0c = auVar24._12_2_;
    sStack_c0a = auVar24._14_2_;
    uStack_c26 = (ushort)bStack_152f;
    uStack_c24 = (ushort)bStack_152e;
    uStack_c22 = (ushort)bStack_152d;
    uStack_c1e = (ushort)bStack_152b;
    uStack_c1c = (ushort)bStack_152a;
    uStack_c1a = (ushort)bStack_1529;
    local_c48 = auVar25._0_2_;
    sStack_c46 = auVar25._2_2_;
    sStack_c44 = auVar25._4_2_;
    sStack_c42 = auVar25._6_2_;
    sStack_c40 = auVar25._8_2_;
    sStack_c3e = auVar25._10_2_;
    sStack_c3c = auVar25._12_2_;
    sStack_c3a = auVar25._14_2_;
    uVar20 = local_c48 + (ushort)local_1438 * local_c18 + 0x80;
    uVar27 = sStack_c46 + uStack_c06 * sStack_c16 + 0x80;
    uVar31 = sStack_c44 + uStack_c04 * sStack_c14 + 0x80;
    uVar35 = sStack_c42 + uStack_c02 * sStack_c12 + 0x80;
    uVar39 = sStack_c40 + (ushort)bStack_1434 * sStack_c10 + 0x80;
    uVar43 = sStack_c3e + uStack_bfe * sStack_c0e + 0x80;
    uVar47 = sStack_c3c + uStack_bfc * sStack_c0c + 0x80;
    uVar51 = sStack_c3a + uStack_bfa * sStack_c0a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_c48 + (ushort)bStack_1530 * local_c18 + 0x80;
    uVar29 = sStack_c46 + uStack_c26 * sStack_c16 + 0x80;
    uVar33 = sStack_c44 + uStack_c24 * sStack_c14 + 0x80;
    uVar37 = sStack_c42 + uStack_c22 * sStack_c12 + 0x80;
    uVar41 = sStack_c40 + (ushort)bStack_152c * sStack_c10 + 0x80;
    uVar45 = sStack_c3e + uStack_c1e * sStack_c0e + 0x80;
    uVar49 = sStack_c3c + uStack_c1c * sStack_c0c + 0x80;
    uVar53 = sStack_c3a + uStack_c1a * sStack_c0a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_16d0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_16d0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_dc6 = (ushort)bStack_1477;
    uStack_dc4 = (ushort)bStack_1476;
    uStack_dc2 = (ushort)bStack_1475;
    uStack_dbe = (ushort)bStack_1473;
    uStack_dbc = (ushort)bStack_1472;
    uStack_dba = (ushort)bStack_1471;
    uStack_de6 = (ushort)bStack_154f;
    uStack_de4 = (ushort)bStack_154e;
    uStack_de2 = (ushort)bStack_154d;
    uStack_dde = (ushort)bStack_154b;
    uStack_ddc = (ushort)bStack_154a;
    uStack_dda = (ushort)bStack_1549;
    uVar20 = local_c48 + (ushort)local_1478 * local_c18 + 0x80;
    uVar27 = sStack_c46 + uStack_dc6 * sStack_c16 + 0x80;
    uVar31 = sStack_c44 + uStack_dc4 * sStack_c14 + 0x80;
    uVar35 = sStack_c42 + uStack_dc2 * sStack_c12 + 0x80;
    uVar39 = sStack_c40 + (ushort)bStack_1474 * sStack_c10 + 0x80;
    uVar43 = sStack_c3e + uStack_dbe * sStack_c0e + 0x80;
    uVar47 = sStack_c3c + uStack_dbc * sStack_c0c + 0x80;
    uVar51 = sStack_c3a + uStack_dba * sStack_c0a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_c48 + (ushort)bStack_1550 * local_c18 + 0x80;
    uVar29 = sStack_c46 + uStack_de6 * sStack_c16 + 0x80;
    uVar33 = sStack_c44 + uStack_de4 * sStack_c14 + 0x80;
    uVar37 = sStack_c42 + uStack_de2 * sStack_c12 + 0x80;
    uVar41 = sStack_c40 + (ushort)bStack_154c * sStack_c10 + 0x80;
    uVar45 = sStack_c3e + uStack_dde * sStack_c0e + 0x80;
    uVar49 = sStack_c3c + uStack_ddc * sStack_c0c + 0x80;
    uVar53 = sStack_c3a + uStack_dda * sStack_c0a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_16d0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_16d0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_16d0 = (undefined8 *)(in_RSI + (long)local_16d0);
  }
  for (local_192c = 0x1000100; local_192c < 0xf0e0f0f; local_192c = local_192c + 0x2020202) {
    auVar6._8_7_ = 0x800080009000a;
    auVar6._0_8_ = 0xc000e00110015;
    auVar6[0xf] = 0;
    auVar26._8_8_ = CONCAT44(local_192c,local_192c);
    auVar26._0_8_ = CONCAT44(local_192c,local_192c);
    auVar26 = pshufb(auVar6,auVar26);
    auVar25._2_2_ = uStack_1346 * 0xef;
    auVar25._0_2_ = uVar19 * 0xeb;
    auVar25._4_2_ = uStack_1344 * 0xf2;
    auVar25._6_2_ = uStack_13a2 * 0xf4;
    auVar25._10_2_ = uStack_133e * 0xf7;
    auVar25._8_2_ = uVar19 * 0xf6;
    auVar25._12_2_ = uStack_133c * 0xf8;
    auVar25._14_2_ = uStack_139a * 0xf8;
    auVar24._8_8_ = CONCAT44(local_192c,local_192c);
    auVar24._0_8_ = CONCAT44(local_192c,local_192c);
    auVar24 = pshufb(auVar25,auVar24);
    uStack_f86 = (ushort)bStack_1437;
    uStack_f84 = (ushort)bStack_1436;
    uStack_f82 = (ushort)bStack_1435;
    uStack_f7e = (ushort)bStack_1433;
    uStack_f7c = (ushort)bStack_1432;
    uStack_f7a = (ushort)bStack_1431;
    local_f98 = auVar26._0_2_;
    sStack_f96 = auVar26._2_2_;
    sStack_f94 = auVar26._4_2_;
    sStack_f92 = auVar26._6_2_;
    sStack_f90 = auVar26._8_2_;
    sStack_f8e = auVar26._10_2_;
    sStack_f8c = auVar26._12_2_;
    sStack_f8a = auVar26._14_2_;
    uStack_fa6 = (ushort)bStack_152f;
    uStack_fa4 = (ushort)bStack_152e;
    uStack_fa2 = (ushort)bStack_152d;
    uStack_f9e = (ushort)bStack_152b;
    uStack_f9c = (ushort)bStack_152a;
    uStack_f9a = (ushort)bStack_1529;
    local_fc8 = auVar24._0_2_;
    sStack_fc6 = auVar24._2_2_;
    sStack_fc4 = auVar24._4_2_;
    sStack_fc2 = auVar24._6_2_;
    sStack_fc0 = auVar24._8_2_;
    sStack_fbe = auVar24._10_2_;
    sStack_fbc = auVar24._12_2_;
    sStack_fba = auVar24._14_2_;
    uVar20 = local_fc8 + (ushort)local_1438 * local_f98 + 0x80;
    uVar27 = sStack_fc6 + uStack_f86 * sStack_f96 + 0x80;
    uVar31 = sStack_fc4 + uStack_f84 * sStack_f94 + 0x80;
    uVar35 = sStack_fc2 + uStack_f82 * sStack_f92 + 0x80;
    uVar39 = sStack_fc0 + (ushort)bStack_1434 * sStack_f90 + 0x80;
    uVar43 = sStack_fbe + uStack_f7e * sStack_f8e + 0x80;
    uVar47 = sStack_fbc + uStack_f7c * sStack_f8c + 0x80;
    uVar51 = sStack_fba + uStack_f7a * sStack_f8a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_fc8 + (ushort)bStack_1530 * local_f98 + 0x80;
    uVar29 = sStack_fc6 + uStack_fa6 * sStack_f96 + 0x80;
    uVar33 = sStack_fc4 + uStack_fa4 * sStack_f94 + 0x80;
    uVar37 = sStack_fc2 + uStack_fa2 * sStack_f92 + 0x80;
    uVar41 = sStack_fc0 + (ushort)bStack_152c * sStack_f90 + 0x80;
    uVar45 = sStack_fbe + uStack_f9e * sStack_f8e + 0x80;
    uVar49 = sStack_fbc + uStack_f9c * sStack_f8c + 0x80;
    uVar53 = sStack_fba + uStack_f9a * sStack_f8a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_16d0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_16d0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1146 = (ushort)bStack_1477;
    uStack_1144 = (ushort)bStack_1476;
    uStack_1142 = (ushort)bStack_1475;
    uStack_113e = (ushort)bStack_1473;
    uStack_113c = (ushort)bStack_1472;
    uStack_113a = (ushort)bStack_1471;
    uStack_1166 = (ushort)bStack_154f;
    uStack_1164 = (ushort)bStack_154e;
    uStack_1162 = (ushort)bStack_154d;
    uStack_115e = (ushort)bStack_154b;
    uStack_115c = (ushort)bStack_154a;
    uStack_115a = (ushort)bStack_1549;
    uVar20 = local_fc8 + (ushort)local_1478 * local_f98 + 0x80;
    uVar27 = sStack_fc6 + uStack_1146 * sStack_f96 + 0x80;
    uVar31 = sStack_fc4 + uStack_1144 * sStack_f94 + 0x80;
    uVar35 = sStack_fc2 + uStack_1142 * sStack_f92 + 0x80;
    uVar39 = sStack_fc0 + (ushort)bStack_1474 * sStack_f90 + 0x80;
    uVar43 = sStack_fbe + uStack_113e * sStack_f8e + 0x80;
    uVar47 = sStack_fbc + uStack_113c * sStack_f8c + 0x80;
    uVar51 = sStack_fba + uStack_113a * sStack_f8a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_fc8 + (ushort)bStack_1550 * local_f98 + 0x80;
    uVar29 = sStack_fc6 + uStack_1166 * sStack_f96 + 0x80;
    uVar33 = sStack_fc4 + uStack_1164 * sStack_f94 + 0x80;
    uVar37 = sStack_fc2 + uStack_1162 * sStack_f92 + 0x80;
    uVar41 = sStack_fc0 + (ushort)bStack_154c * sStack_f90 + 0x80;
    uVar45 = sStack_fbe + uStack_115e * sStack_f8e + 0x80;
    uVar49 = sStack_fbc + uStack_115c * sStack_f8c + 0x80;
    uVar53 = sStack_fba + uStack_115a * sStack_f8a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_16d0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_16d0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_16d0 = (undefined8 *)(in_RSI + (long)local_16d0);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}